

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

int compute_minmax_8x8(uint8_t *src_buf,int src_stride,uint8_t *dst_buf,int dst_stride,int x16_idx,
                      int y16_idx,int highbd_flag,int pixels_wide,int pixels_high)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int max;
  int min;
  int y8_idx;
  int x8_idx;
  int idx;
  int minmax_min;
  int minmax_max;
  int iVar3;
  int iVar4;
  uint local_30;
  int dp;
  int iVar5;
  
  iVar5 = 0;
  dp = 0xff;
  for (local_30 = 0; (int)local_30 < 4; local_30 = local_30 + 1) {
    iVar1 = in_R8D + (local_30 & 1) * 8;
    iVar2 = in_R9D + ((int)local_30 >> 1) * 8;
    iVar4 = 0;
    iVar3 = 0;
    if ((iVar1 < y8_idx) && (iVar2 < idx)) {
      if ((max & 8U) == 0) {
        aom_minmax_8x8_sse2(in_RDX,in_ECX,(uint8_t *)CONCAT44(in_R9D,iVar5),dp,
                            (int *)CONCAT44(iVar1,iVar2),(int *)0x0);
      }
      else {
        aom_highbd_minmax_8x8_c
                  ((uint8_t *)(in_RDI + iVar2 * in_ESI + (long)iVar1),in_ESI,
                   in_RDX + (long)iVar1 + (long)(iVar2 * in_ECX),in_ECX,
                   (int *)&stack0xffffffffffffffc4,(int *)&stack0xffffffffffffffc0);
      }
      if (iVar5 < iVar3 - iVar4) {
        iVar5 = iVar3 - iVar4;
      }
      if (iVar3 - iVar4 < dp) {
        dp = iVar3 - iVar4;
      }
    }
  }
  return iVar5 - dp;
}

Assistant:

static int compute_minmax_8x8(const uint8_t *src_buf, int src_stride,
                              const uint8_t *dst_buf, int dst_stride,
                              int x16_idx, int y16_idx,
#if CONFIG_AV1_HIGHBITDEPTH
                              int highbd_flag,
#endif
                              int pixels_wide, int pixels_high) {
  int minmax_max = 0;
  int minmax_min = 255;
  // Loop over the 4 8x8 subblocks.
  for (int idx = 0; idx < 4; idx++) {
    const int x8_idx = x16_idx + GET_BLK_IDX_X(idx, 3);
    const int y8_idx = y16_idx + GET_BLK_IDX_Y(idx, 3);
    int min = 0;
    int max = 0;
    if (x8_idx < pixels_wide && y8_idx < pixels_high) {
#if CONFIG_AV1_HIGHBITDEPTH
      if (highbd_flag & YV12_FLAG_HIGHBITDEPTH) {
        aom_highbd_minmax_8x8(
            src_buf + y8_idx * src_stride + x8_idx, src_stride,
            dst_buf + y8_idx * dst_stride + x8_idx, dst_stride, &min, &max);
      } else {
        aom_minmax_8x8(src_buf + y8_idx * src_stride + x8_idx, src_stride,
                       dst_buf + y8_idx * dst_stride + x8_idx, dst_stride, &min,
                       &max);
      }
#else
      aom_minmax_8x8(src_buf + y8_idx * src_stride + x8_idx, src_stride,
                     dst_buf + y8_idx * dst_stride + x8_idx, dst_stride, &min,
                     &max);
#endif
      if ((max - min) > minmax_max) minmax_max = (max - min);
      if ((max - min) < minmax_min) minmax_min = (max - min);
    }
  }
  return (minmax_max - minmax_min);
}